

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O1

bool __thiscall Api::interpret(Api *this,string *str)

{
  int iVar1;
  
  iVar1 = std::__cxx11::string::compare((char *)str);
  if (iVar1 == 0) {
    getRemainCard(this,0,true);
    getRemainCard(this,1,true);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)str);
    if (iVar1 == 0) {
      getBoardPlayer(this,0,true);
      getBoardPlayer(this,1,true);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)str);
      if (iVar1 == 0) {
        getCurrentHand(this,true);
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)str);
        if (iVar1 != 0) {
          return false;
        }
        endTurn(this);
      }
    }
  }
  return true;
}

Assistant:

bool Api::interpret(std::string str) {

    if (str == "REMAINING CARD") {
        this->getRemainCard(0, true);
        this->getRemainCard(1, true);
    } else if (str == "BOARD") {
        this->getBoardPlayer(0, true);
        this->getBoardPlayer(1, true);
    } else if (str == "HAND") {
        this->getCurrentHand(true);
    } else if (str == "END") {
        this->endTurn();
    } else {
        return false;
    }
    return true;
}